

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  Snapshot *this_00;
  _Alloc_hider filename;
  bool bVar1;
  char *pcVar2;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *pcVar3;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string currentStart;
  cmListFile listFile;
  string filesDir;
  BuildsystemFileScope scope;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  string local_c8;
  cmListFile local_a8;
  long *local_90 [2];
  long local_80 [2];
  Snapshot local_70;
  BuildsystemFileScope local_58;
  
  BuildsystemFileScope::BuildsystemFileScope(&local_58,this);
  this_00 = &this->StateSnapshot;
  cmState::Snapshot::GetDirectory((Directory *)local_f8,this_00);
  pcVar2 = cmState::Directory::GetCurrentBinary((Directory *)local_f8);
  std::__cxx11::string::string((string *)local_90,pcVar2,(allocator *)(local_e0 + 0x18));
  std::__cxx11::string::append((char *)local_90);
  cmsys::SystemTools::MakeDirectory((char *)local_90[0]);
  cmState::Snapshot::GetDirectory((Directory *)local_f8,this_00);
  pcVar2 = cmState::Directory::GetCurrentSource((Directory *)local_f8);
  std::__cxx11::string::string((string *)(local_e0 + 0x18),pcVar2,(allocator *)&local_70);
  std::__cxx11::string::append(local_e0 + 0x18);
  bVar1 = cmsys::SystemTools::FileExists(local_c8._M_dataplus._M_p,true);
  if (bVar1) {
    local_f8._0_8_ = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CMAKE_PARENT_LIST_FILE","");
    AddDefinition(this,(string *)local_f8,local_c8._M_dataplus._M_p);
    if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_f8._0_8_ !=
        (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_e8) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)local_e8 + 1));
    }
    local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmParseFileScope::cmParseFileScope((cmParseFileScope *)local_f8,this);
    filename._M_p = local_c8._M_dataplus._M_p;
    cmState::Snapshot::GetBuildsystemDirectoryParent(&local_70,this_00);
    bVar1 = cmState::Snapshot::IsValid(&local_70);
    bVar1 = cmListFile::ParseFile(&local_a8,filename._M_p,!bVar1,this);
    (((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)(local_f8._0_8_ + 0x660))->Data).
    super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&(((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)
                           (local_f8._0_8_ + 0x660))->Data).
                          super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].Children.
                          super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                  + 0x10);
    if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_f8._8_8_ !=
        (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_e0) {
      operator_delete((void *)local_f8._8_8_,(ulong)(local_e0._0_8_ + 1));
    }
    if (bVar1) {
      ReadListFile(this,&local_a8,(string *)(local_e0 + 0x18));
      if ((cmSystemTools::s_FatalErrorOccured != false) ||
         (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) {
        local_58.ReportError = false;
      }
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_f8,
                 &this->UnConfiguredDirectories);
      pcVar3 = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_f8._0_8_;
      if (local_f8._0_8_ != local_f8._8_8_) {
        do {
          cmState::Snapshot::InitializeFromParent_ForSubdirsCommand
                    ((Snapshot *)
                     &(pcVar3->Data).
                      super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].RelativePathTopSource);
          ConfigureSubDirectory
                    (this,(cmMakefile *)
                          (pcVar3->Data).
                          super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          pcVar3 = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)
                   &(pcVar3->Data).
                    super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (pcVar3 != (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_f8._8_8_);
      }
      AddCMakeDependFilesFromUser(this);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_f8._0_8_ !=
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)0x0) {
        operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
      }
    }
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
              (&local_a8.Functions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    BuildsystemFileScope::~BuildsystemFileScope(&local_58);
    return;
  }
  __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x676,"void cmMakefile::Configure()");
}

Assistant:

void cmMakefile::Configure()
{
  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  std::string currentStart =
      this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";
  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(currentStart.c_str(), this->IsRootMakefile(), this))
    {
    return;
    }
  }
  this->ReadListFile(listFile, currentStart);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    scope.Quiet();
    }

   // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi)
    {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
    }

  this->AddCMakeDependFilesFromUser();
}